

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_client_request.cxx
# Opt level: O0

void __thiscall nuraft::raft_server::request_append_entries_for_all(raft_server *this)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  nuraft_global_mgr *this_00;
  element_type *peVar4;
  context *in_RDI;
  unique_lock<std::recursive_mutex> guard;
  nuraft_global_mgr *mgr;
  ptr<raft_params> params;
  mutex_type *in_stack_ffffffffffffff68;
  unique_lock<std::recursive_mutex> *in_stack_ffffffffffffff70;
  raft_server *in_stack_ffffffffffffffb0;
  
  std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
            ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x1f6f68);
  context::get_params(in_RDI);
  peVar3 = std::__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1f6f85);
  if ((peVar3->use_bg_thread_for_urgent_commit_ & 1U) == 0) {
    std::unique_lock<std::recursive_mutex>::unique_lock
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    request_append_entries(in_stack_ffffffffffffffb0);
    std::unique_lock<std::recursive_mutex>::~unique_lock(in_stack_ffffffffffffff70);
  }
  else {
    this_00 = nuraft_global_mgr::get_instance();
    if (this_00 == (nuraft_global_mgr *)0x0) {
      EventAwaiter::invoke((EventAwaiter *)0x0);
    }
    else {
      bVar1 = std::__shared_ptr::operator_cast_to_bool
                        ((__shared_ptr *)
                         &in_RDI[4].logger_.
                          super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                        );
      if (bVar1) {
        peVar4 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1f6fdc);
        iVar2 = (*peVar4->_vptr_logger[7])();
        if (5 < iVar2) {
          peVar4 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1f700c);
          msg_if_given_abi_cxx11_(&stack0xffffffffffffffb0,"found global thread pool");
          (*peVar4->_vptr_logger[8])
                    (peVar4,6,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_client_request.cxx"
                     ,"request_append_entries_for_all",0x49,&stack0xffffffffffffffb0);
          std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
        }
      }
      std::enable_shared_from_this<nuraft::raft_server>::shared_from_this
                ((enable_shared_from_this<nuraft::raft_server> *)this_00);
      nuraft_global_mgr::request_append
                ((nuraft_global_mgr *)guard._8_8_,(ptr<raft_server> *)guard._M_device);
      std::shared_ptr<nuraft::raft_server>::~shared_ptr((shared_ptr<nuraft::raft_server> *)0x1f70c8)
      ;
    }
  }
  std::shared_ptr<nuraft::raft_params>::~shared_ptr((shared_ptr<nuraft::raft_params> *)0x1f714f);
  return;
}

Assistant:

void raft_server::request_append_entries_for_all() {
    ptr<raft_params> params = ctx_->get_params();
    if (params->use_bg_thread_for_urgent_commit_) {
        // Let background generate request (some delay may happen).
        nuraft_global_mgr* mgr = nuraft_global_mgr::get_instance();
        if (mgr) {
            // Global thread pool exists, request it.
            p_tr("found global thread pool");
            mgr->request_append( this->shared_from_this() );
        } else {
            bg_append_ea_->invoke();
        }
    } else {
        // Directly generate request in user thread.
        recur_lock(lock_);
        request_append_entries();
    }
}